

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

uint nullcDebugEnumStackFrame(uint frame)

{
  uint uVar1;
  
  if (NULLC::currExec == 0) {
    uVar1 = ExecutorRegVm::GetCallStackAddress(NULLC::executorRegVm,frame);
    return uVar1;
  }
  if (NULLC::currExec == 1) {
    uVar1 = ExecutorX86::GetCallStackAddress(NULLC::executorX86,frame);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned int nullcDebugEnumStackFrame(unsigned frame)
{
	using namespace NULLC;

	unsigned address = 0;

	// Get next address from call stack
	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		address = executorX86->GetCallStackAddress(frame);
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
#ifndef NULLC_NO_EXECUTOR
		address = executorRegVm->GetCallStackAddress(frame);
#endif
	}

	(void)frame;

	return address;
}